

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,uint n_row,uint n_col)

{
  pointer pvVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  EVP_PKEY_CTX *ctx;
  vector<double,_std::allocator<double>_> *vec;
  pointer this_00;
  
  (this->m_elems).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_elems).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_elems).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_shape).n_row = n_row;
  (this->m_shape).n_col = n_col;
  (this->m_shape).is_diogonal = false;
  ctx = (EVP_PKEY_CTX *)(ulong)n_row;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->m_elems,(size_type)ctx);
  pvVar1 = (this->m_elems).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_elems).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1; this_00 = this_00 + 1
      ) {
    ctx = (EVP_PKEY_CTX *)(ulong)n_col;
    std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)(ulong)n_col);
  }
  init(this,ctx);
  return;
}

Assistant:

Matrix<T>::Matrix(unsigned n_row, unsigned n_col){
    m_shape={n_row, n_col};

    m_elems.resize(n_row);
    for(auto& vec: m_elems)
        vec.resize(n_col);
    init();
}